

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O0

void __thiscall cppcms::widgets::textarea::textarea(textarea *this)

{
  void **in_RDI;
  base_text *unaff_retaddr;
  void **vtt;
  
  vtt = in_RDI;
  base_widget::base_widget((base_widget *)this);
  base_text::base_text(unaff_retaddr,vtt);
  *in_RDI = vtable + 0x18;
  in_RDI[0xb] = vtable + 0x98;
  *(undefined4 *)(in_RDI + 9) = 0xffffffff;
  *(undefined4 *)((long)in_RDI + 0x4c) = 0xffffffff;
  booster::hold_ptr<cppcms::widgets::textarea::_data>::hold_ptr
            ((hold_ptr<cppcms::widgets::textarea::_data> *)(in_RDI + 10));
  return;
}

Assistant:

textarea::textarea() : rows_(-1), cols_(-1) {}